

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_util.h
# Opt level: O0

void google::protobuf::TestUtil::SetOptionalFields<edition_unittest::TestAllTypes>
               (TestAllTypes *message)

{
  TestAllTypes *pTVar1;
  TestAllTypes *s;
  char *s_00;
  uint32_t *puVar2;
  Arena *pAVar3;
  TestAllTypes_OptionalGroup *this;
  TestAllTypes_NestedMessage *pTVar4;
  ForeignMessage *this_00;
  ImportMessage *this_01;
  PublicImportMessage *this_02;
  Reflection *pRVar5;
  Descriptor *pDVar6;
  FieldDescriptor *pFVar7;
  string_view local_d0;
  allocator<char> local_b9;
  string local_b8;
  string_view local_98 [2];
  allocator<char> local_71;
  string local_70;
  string_view local_50;
  TestAllTypes *local_40;
  TestAllTypes *message_local;
  TestAllTypes *local_30;
  anon_union_888_1_493b367e_for_TestAllTypes_11 *local_28;
  char *local_20;
  TestAllTypes *local_18;
  anon_union_888_1_493b367e_for_TestAllTypes_11 *local_10;
  
  local_40 = message;
  edition_unittest::TestAllTypes::set_optional_int32(message,0x65);
  edition_unittest::TestAllTypes::set_optional_int64(local_40,0x66);
  edition_unittest::TestAllTypes::set_optional_uint32(local_40,0x67);
  edition_unittest::TestAllTypes::set_optional_uint64(local_40,0x68);
  edition_unittest::TestAllTypes::set_optional_sint32(local_40,0x69);
  edition_unittest::TestAllTypes::set_optional_sint64(local_40,0x6a);
  edition_unittest::TestAllTypes::set_optional_fixed32(local_40,0x6b);
  edition_unittest::TestAllTypes::set_optional_fixed64(local_40,0x6c);
  edition_unittest::TestAllTypes::set_optional_sfixed32(local_40,0x6d);
  edition_unittest::TestAllTypes::set_optional_sfixed64(local_40,0x6e);
  edition_unittest::TestAllTypes::set_optional_float(local_40,111.0);
  edition_unittest::TestAllTypes::set_optional_double(local_40,112.0);
  edition_unittest::TestAllTypes::set_optional_bool(local_40,true);
  pTVar1 = local_40;
  local_30 = local_40;
  message_local = (TestAllTypes *)anon_var_dwarf_65991;
  local_28 = &local_40->field_0;
  puVar2 = internal::HasBits<2>::operator[](&(local_28->_impl_)._has_bits_,0);
  s = message_local;
  *(byte *)puVar2 = (byte)*puVar2 | 1;
  pAVar3 = protobuf::MessageLite::GetArena((MessageLite *)pTVar1);
  internal::ArenaStringPtr::Set(&(pTVar1->field_0)._impl_.optional_string_,(char *)s,pAVar3);
  pTVar1 = local_40;
  local_18 = local_40;
  local_20 = "116";
  local_10 = &local_40->field_0;
  puVar2 = internal::HasBits<2>::operator[](&(local_10->_impl_)._has_bits_,0);
  s_00 = local_20;
  *(byte *)puVar2 = (byte)*puVar2 | 2;
  pAVar3 = protobuf::MessageLite::GetArena((MessageLite *)pTVar1);
  internal::ArenaStringPtr::Set(&(pTVar1->field_0)._impl_.optional_bytes_,s_00,pAVar3);
  this = edition_unittest::TestAllTypes::mutable_optionalgroup(local_40);
  edition_unittest::TestAllTypes_OptionalGroup::set_a(this,0x75);
  pTVar4 = edition_unittest::TestAllTypes::mutable_optional_nested_message(local_40);
  edition_unittest::TestAllTypes_NestedMessage::set_bb(pTVar4,0x76);
  this_00 = edition_unittest::TestAllTypes::mutable_optional_foreign_message(local_40);
  edition_unittest::ForeignMessage::set_c(this_00,0x77);
  this_01 = edition_unittest::TestAllTypes::mutable_optional_import_message(local_40);
  proto2_unittest_import::ImportMessage::set_d(this_01,0x78);
  this_02 = edition_unittest::TestAllTypes::mutable_optional_public_import_message(local_40);
  proto2_unittest_import::PublicImportMessage::set_e(this_02,0x7e);
  pTVar4 = edition_unittest::TestAllTypes::mutable_optional_lazy_message(local_40);
  edition_unittest::TestAllTypes_NestedMessage::set_bb(pTVar4,0x7f);
  pTVar4 = edition_unittest::TestAllTypes::mutable_optional_unverified_lazy_message(local_40);
  edition_unittest::TestAllTypes_NestedMessage::set_bb(pTVar4,0x80);
  edition_unittest::TestAllTypes::set_optional_nested_enum(local_40,TestAllTypes_NestedEnum_BAZ);
  edition_unittest::TestAllTypes::set_optional_foreign_enum(local_40,FOREIGN_BAZ);
  edition_unittest::TestAllTypes::set_optional_import_enum(local_40,IMPORT_BAZ);
  pRVar5 = edition_unittest::TestAllTypes::GetReflection();
  pTVar1 = local_40;
  pDVar6 = edition_unittest::TestAllTypes::GetDescriptor();
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_50,"optional_string_piece");
  pFVar7 = Descriptor::FindFieldByName(pDVar6,local_50);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"124",&local_71);
  Reflection::SetString(pRVar5,&pTVar1->super_Message,pFVar7,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  pRVar5 = edition_unittest::TestAllTypes::GetReflection();
  pTVar1 = local_40;
  pDVar6 = edition_unittest::TestAllTypes::GetDescriptor();
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(local_98,"optional_cord")
  ;
  pFVar7 = Descriptor::FindFieldByName(pDVar6,local_98[0]);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"125",&local_b9);
  Reflection::SetString(pRVar5,&pTVar1->super_Message,pFVar7,&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator(&local_b9);
  pTVar1 = local_40;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_d0,"optional bytes cord");
  edition_unittest::TestAllTypes::set_optional_bytes_cord(pTVar1,local_d0);
  return;
}

Assistant:

void SetOptionalFields(TestAllTypes* message) {
  message->set_optional_int32(101);
  message->set_optional_int64(102);
  message->set_optional_uint32(103);
  message->set_optional_uint64(104);
  message->set_optional_sint32(105);
  message->set_optional_sint64(106);
  message->set_optional_fixed32(107);
  message->set_optional_fixed64(108);
  message->set_optional_sfixed32(109);
  message->set_optional_sfixed64(110);
  message->set_optional_float(111);
  message->set_optional_double(112);
  message->set_optional_bool(true);
  message->set_optional_string("115");
  message->set_optional_bytes("116");

  message->mutable_optionalgroup()->set_a(117);
  message->mutable_optional_nested_message()->set_bb(118);
  message->mutable_optional_foreign_message()->set_c(119);
  message->mutable_optional_import_message()->set_d(120);
  message->mutable_optional_public_import_message()->set_e(126);
  message->mutable_optional_lazy_message()->set_bb(127);
  message->mutable_optional_unverified_lazy_message()->set_bb(128);

  message->set_optional_nested_enum(TestAllTypes::BAZ);
  message->set_optional_foreign_enum(ForeignEnum<TestAllTypes>::FOREIGN_BAZ);
  message->set_optional_import_enum(ImportEnum<TestAllTypes>::IMPORT_BAZ);

  // StringPiece and Cord fields are only accessible via reflection in the
  // open source release; see comments in compiler/cpp/string_field.cc.
#ifndef PROTOBUF_TEST_NO_DESCRIPTORS
  message->GetReflection()->SetString(
      message,
      message->GetDescriptor()->FindFieldByName("optional_string_piece"),
      "124");
  message->GetReflection()->SetString(
      message, message->GetDescriptor()->FindFieldByName("optional_cord"),
      "125");
#endif  // !PROTOBUF_TEST_NO_DESCRIPTORS
  message->set_optional_bytes_cord("optional bytes cord");
}